

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall pegmatite::Context::Context(Context *this,Input *i,Rule *ws,ParserDelegate *d)

{
  iterator iVar1;
  ParserDelegate *d_local;
  Rule *ws_local;
  Input *i_local;
  Context *this_local;
  
  this->whitespace_rule = ws;
  ParserPosition::ParserPosition(&this->position,i);
  ParserPosition::ParserPosition(&this->error_pos,i);
  iVar1 = Input::begin(i);
  this->start = iVar1;
  iVar1 = Input::end(i);
  this->finish = iVar1;
  std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  ::vector(&this->matches);
  this->depth = 0;
  this->delegate = d;
  std::
  unordered_map<const_pegmatite::Rule_*,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>,_std::hash<const_pegmatite::Rule_*>,_std::equal_to<const_pegmatite::Rule_*>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>_>
  ::unordered_map(&this->rule_states);
  std::
  unordered_map<pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>,_pegmatite::Context::CacheKeyHash,_std::equal_to<pegmatite::Context::CacheKey>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>_>
  ::unordered_map(&this->cache);
  return;
}

Assistant:

Context(Input &i, const Rule &ws, const ParserDelegate &d) :
		whitespace_rule(ws),
		position(i),
		error_pos(i),
		start(i.begin()),
		finish(i.end()),
		delegate(d)
	{
	}